

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_perform_upgrade_tls(Curl_easy *data)

{
  undefined1 *puVar1;
  connectdata *conn;
  _Bool _Var2;
  CURLcode CVar3;
  ulong in_RAX;
  _Bool ssldone;
  undefined8 uStack_18;
  
  conn = data->conn;
  uStack_18 = in_RAX & 0xffffffffffffff;
  _Var2 = Curl_conn_is_ssl(conn,0);
  if ((!_Var2) && (CVar3 = Curl_ssl_cfilter_add(data,conn,0), CVar3 != CURLE_OK)) {
    return CVar3;
  }
  CVar3 = Curl_conn_connect(data,0,false,(_Bool *)((long)&uStack_18 + 7));
  if (CVar3 == CURLE_OK) {
    *(byte *)((long)&conn->proto + 0xd0) =
         *(byte *)((long)&conn->proto + 0xd0) & 0xfe | uStack_18._7_1_;
    if ((conn->proto).smtpc.state != SMTP_UPGRADETLS) {
      smtp_state(data,SMTP_UPGRADETLS);
    }
    CVar3 = CURLE_OK;
    if ((*(byte *)((long)&conn->proto + 0xd0) & 1) != 0) {
      conn->handler = &Curl_handler_smtps;
      puVar1 = &(conn->bits).field_0x3;
      *puVar1 = *puVar1 | 8;
      CVar3 = smtp_perform_ehlo(data);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_perform_upgrade_tls(struct Curl_easy *data)
{
  /* Start the SSL connection */
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  CURLcode result;
  bool ssldone = FALSE;

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
    result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
    if(result)
      goto out;
  }

  result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
  if(!result) {
    smtpc->ssldone = ssldone;
    if(smtpc->state != SMTP_UPGRADETLS)
      smtp_state(data, SMTP_UPGRADETLS);

    if(smtpc->ssldone) {
      smtp_to_smtps(conn);
      result = smtp_perform_ehlo(data);
    }
  }
out:
  return result;
}